

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchncnn.cpp
# Opt level: O2

void benchmark(char *comment,Mat *_in,Option *opt)

{
  double dVar1;
  int i;
  int iVar2;
  bool bVar3;
  double dVar4;
  double local_2a0;
  double local_298;
  double local_290;
  DataReaderFromEmpty dr;
  Extractor ex;
  Mat out;
  Mat in;
  Net net;
  char parampath [256];
  
  ncnn::Mat::Mat(&in,_in);
  ncnn::Mat::fill(&in,0.01);
  ncnn::Net::Net(&net);
  net.opt.use_int8_arithmetic = opt->use_int8_arithmetic;
  net.opt.use_packing_layout = opt->use_packing_layout;
  net.opt.lightmode = opt->lightmode;
  net.opt._1_3_ = *(undefined3 *)&opt->field_0x1;
  net.opt.num_threads = opt->num_threads;
  net.opt.blob_allocator._0_4_ = *(undefined4 *)&opt->blob_allocator;
  net.opt.blob_allocator._4_4_ = *(undefined4 *)((long)&opt->blob_allocator + 4);
  net.opt.workspace_allocator = opt->workspace_allocator;
  net.opt.use_winograd_convolution = opt->use_winograd_convolution;
  net.opt.use_sgemm_convolution = opt->use_sgemm_convolution;
  net.opt.use_int8_inference = opt->use_int8_inference;
  net.opt.use_vulkan_compute = opt->use_vulkan_compute;
  net.opt.use_fp16_packed = opt->use_fp16_packed;
  net.opt.use_fp16_storage = opt->use_fp16_storage;
  net.opt.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  net.opt.use_int8_storage = opt->use_int8_storage;
  sprintf(parampath,"%s.param",comment);
  ncnn::Net::load_param(&net,parampath);
  dr.super_DataReader._vptr_DataReader = (DataReader)&PTR__DataReader_00173700;
  ncnn::Net::load_model(&net,&dr.super_DataReader);
  ncnn::UnlockedPoolAllocator::clear(&g_blob_pool_allocator);
  ncnn::PoolAllocator::clear(&g_workspace_pool_allocator);
  sleep(10);
  out.elemsize._0_4_ = 0;
  out._20_8_ = 0;
  out.data = (void *)0x0;
  out.refcount._0_4_ = 0;
  out.refcount._4_4_ = 0;
  out.allocator = (Allocator *)0x0;
  out.dims = 0;
  out.w = 0;
  out.h = 0;
  out.c = 0;
  out.cstep = 0;
  iVar2 = 8;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    ncnn::Net::create_extractor(&ex,&net);
    ncnn::Extractor::input(&ex,"data",&in);
    ncnn::Extractor::extract(&ex,"output",&out);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&ex.blob_mats);
  }
  local_290 = 0.0;
  local_2a0 = 1.79769313486232e+308;
  local_298 = -1.79769313486232e+308;
  for (iVar2 = 0; iVar2 < g_loop_count; iVar2 = iVar2 + 1) {
    dVar4 = ncnn::get_current_time();
    ncnn::Net::create_extractor(&ex,&net);
    ncnn::Extractor::input(&ex,"data",&in);
    ncnn::Extractor::extract(&ex,"output",&out);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&ex.blob_mats);
    dVar1 = ncnn::get_current_time();
    dVar1 = dVar1 - dVar4;
    dVar4 = dVar1;
    if (local_2a0 <= dVar1) {
      dVar4 = local_2a0;
    }
    local_290 = local_290 + dVar1;
    if (dVar1 <= local_298) {
      dVar1 = local_298;
    }
    local_2a0 = dVar4;
    local_298 = dVar1;
  }
  fprintf(_stderr,"%20s  min = %7.2f  max = %7.2f  avg = %7.2f\n",SUB84(local_2a0,0),local_298,
          local_290 / (double)g_loop_count,comment);
  ncnn::Mat::~Mat(&out);
  ncnn::DataReader::~DataReader(&dr.super_DataReader);
  ncnn::Net::~Net(&net);
  ncnn::Mat::~Mat(&in);
  return;
}

Assistant:

void benchmark(const char* comment, const ncnn::Mat& _in, const ncnn::Option& opt)
{
    ncnn::Mat in = _in;
    in.fill(0.01f);

    ncnn::Net net;

    net.opt = opt;

#if NCNN_VULKAN
    if (net.opt.use_vulkan_compute)
    {
        net.set_vulkan_device(g_vkdev);
    }
#endif // NCNN_VULKAN

    char parampath[256];
    sprintf(parampath, "%s.param", comment);
    net.load_param(parampath);

    DataReaderFromEmpty dr;
    net.load_model(dr);

    g_blob_pool_allocator.clear();
    g_workspace_pool_allocator.clear();

#if NCNN_VULKAN
    if (net.opt.use_vulkan_compute)
    {
        g_blob_vkallocator->clear();
        g_staging_vkallocator->clear();
    }
#endif // NCNN_VULKAN

    // sleep 10 seconds for cooling down SOC  :(
#ifdef _WIN32
    Sleep(10 * 1000);
#else
    sleep(10);
#endif

    ncnn::Mat out;

    // warm up
    for (int i=0; i<g_warmup_loop_count; i++)
    {
        ncnn::Extractor ex = net.create_extractor();
        ex.input("data", in);
        ex.extract("output", out);
    }

    double time_min = DBL_MAX;
    double time_max = -DBL_MAX;
    double time_avg = 0;

    for (int i=0; i<g_loop_count; i++)
    {
        double start = ncnn::get_current_time();

        {
            ncnn::Extractor ex = net.create_extractor();
            ex.input("data", in);
            ex.extract("output", out);
        }

        double end = ncnn::get_current_time();

        double time = end - start;

        time_min = std::min(time_min, time);
        time_max = std::max(time_max, time);
        time_avg += time;
    }

    time_avg /= g_loop_count;

    fprintf(stderr, "%20s  min = %7.2f  max = %7.2f  avg = %7.2f\n", comment, time_min, time_max, time_avg);
}